

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourcesDictionary.cpp
# Opt level: O2

void __thiscall
ResourcesDictionary::AddImageXObjectMapping
          (ResourcesDictionary *this,PDFImageXObject *inImageXObject,string *inImageXObjectName)

{
  iterator iVar1;
  ObjectIDType local_28;
  
  local_28 = PDFImageXObject::GetImageObjectID(inImageXObject);
  iVar1 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->mXObjects)._M_t,&local_28);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->mXObjects)._M_t._M_impl.super__Rb_tree_header) {
    AddImageXObjectMappingWithName(this,inImageXObject,inImageXObjectName);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&iVar1._M_node[1]._M_parent);
  }
  return;
}

Assistant:

void ResourcesDictionary::AddImageXObjectMapping(PDFImageXObject* inImageXObject, const std::string& inImageXObjectName)
{
	ObjectIDTypeToStringMap::iterator it = mXObjects.find(inImageXObject->GetImageObjectID());

	if(it == mXObjects.end())
		AddImageXObjectMappingWithName(inImageXObject,inImageXObjectName);
	else
		it->second = inImageXObjectName;
}